

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeleteBook.cpp
# Opt level: O1

void __thiscall DeleteBook::operator()(DeleteBook *this)

{
  HttpRequest *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  char cVar3;
  unsigned_short uVar4;
  string *psVar5;
  Session *session;
  long lVar6;
  ostream *poVar7;
  char *pcVar8;
  string reply;
  string id;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  bVar2 = Session::IsConnected((this->super_Event).m_Owner);
  if (bVar2) {
    psVar5 = Session::GetToken_abi_cxx11_((this->super_Event).m_Owner);
    if (psVar5->_M_string_length != 0) {
      local_40._M_string_length = 0;
      local_40.field_2._M_local_buf[0] = '\0';
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Id:",3);
      cVar3 = std::ios::widen((char)*(undefined8 *)(std::cin + -0x18) + -0x60);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)&std::cin,(string *)&local_40,cVar3);
      std::operator+(&local_60,"/api/v1/tema/library/books/",&local_40);
      this_00 = &(this->super_Event).m_Request;
      HttpRequest::SetRequest(this_00,"DELETE",local_60._M_dataplus._M_p,"HTTP/1.1","");
      paVar1 = &local_60.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != paVar1) {
        operator_delete(local_60._M_dataplus._M_p);
      }
      HttpRequest::SetHost(this_00,"ec2-3-8-116-10.eu-west-2.compute.amazonaws.com:8080");
      HttpRequest::ClearHeaders(this_00);
      HttpRequest::AddHeader(this_00,"Connection","keep-alive");
      psVar5 = Session::GetToken_abi_cxx11_((this->super_Event).m_Owner);
      std::operator+(&local_60,"Bearer ",psVar5);
      HttpRequest::AddHeader(this_00,"Authorization",local_60._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != paVar1) {
        operator_delete(local_60._M_dataplus._M_p);
      }
      HttpRequest::ClearCookies(this_00);
      psVar5 = Session::GetConnectSid_abi_cxx11_((this->super_Event).m_Owner);
      HttpRequest::AddCookie(this_00,"connect.sid",(psVar5->_M_dataplus)._M_p);
      HttpRequest::SetData(this_00,"");
      Session::OpenConnection((this->super_Event).m_Owner);
      HttpRequest::Send(this_00,(this->super_Event).m_Owner);
      Connection::ReceiveHttps_abi_cxx11_
                (&local_60,(Connection *)(this->super_Event).m_Owner,session);
      Session::CloseConnection((this->super_Event).m_Owner);
      uVar4 = HttpReply::ExtractSign(&local_60);
      if (uVar4 == 200) {
        poVar7 = (ostream *)&std::cout;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Delete book successes",0x15);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Delete book failed ",0x13);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"error ",6);
        poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      }
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != paVar1) {
        operator_delete(local_60._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != &local_40.field_2) {
        operator_delete(local_40._M_dataplus._M_p);
      }
      return;
    }
    pcVar8 = "To proceed this command you need library access";
    lVar6 = 0x2f;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"You are not connected",0x15);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
    std::ostream::put(-0x30);
    std::ostream::flush();
    pcVar8 = "Please login to proceed this command";
    lVar6 = 0x24;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar8,lVar6);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
  std::ostream::put(-0x30);
  std::ostream::flush();
  return;
}

Assistant:

void DeleteBook::operator()() {
    using namespace std;
    if (!m_Owner->IsConnected()) {
        cout << "You are not connected" << endl;
        cout << "Please login to proceed this command" << endl;
        return;
    }
    else if (m_Owner->GetToken().empty()) {
        cout << "To proceed this command you need library access" << endl;
        return;
    }
    string id;
    cout << "Id:"   ,   getline(cin, id);
    m_Request.SetRequest("DELETE", ("/api/v1/tema/library/books/" + id).c_str(), "HTTP/1.1");
    m_Request.SetHost("ec2-3-8-116-10.eu-west-2.compute.amazonaws.com:8080");
    m_Request.ClearHeaders();
    m_Request.AddHeader("Connection", "keep-alive");
    m_Request.AddHeader("Authorization", ("Bearer " + m_Owner->GetToken()).c_str());
    m_Request.ClearCookies();
    m_Request.AddCookie("connect.sid", m_Owner->GetConnectSid().c_str());
    m_Request.SetData("");
    m_Owner->OpenConnection();
    m_Request.Send(*m_Owner);
    std::string reply = Connection::ReceiveHttps(*m_Owner);
    m_Owner->CloseConnection();
    unsigned short sign = HttpReply::ExtractSign(reply);
    if (sign == 200) {
        cout << "Delete book successes" << std::endl;
    }
    else {
        cout << "Delete book failed " << "error " << sign << std::endl;
    }
}